

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QGridLayoutBox> * __thiscall
QList<QGridLayoutBox>::fill(QList<QGridLayoutBox> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QGridLayoutBox> *pQVar3;
  char *in_RDX;
  __off_t __length;
  void *in_RSI;
  QArrayDataPointer<QGridLayoutBox> *in_RDI;
  long in_FS_OFFSET;
  QGridLayoutBox copy;
  DataPointer detached;
  parameter_type in_stack_ffffffffffffff48;
  parameter_type in_stack_ffffffffffffff50;
  char *pcVar4;
  QGridLayoutBox *in_stack_ffffffffffffff58;
  QArrayDataPointer<QGridLayoutBox> *in_stack_ffffffffffffff60;
  qsizetype in_stack_ffffffffffffff68;
  QArrayDataPointer<QGridLayoutBox> *in_stack_ffffffffffffff70;
  qsizetype local_58 [6];
  QArrayDataPointer<QGridLayoutBox> local_28;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if (in_RDX == (char *)0xffffffffffffffff) {
    local_10 = (char *)size((QList<QGridLayoutBox> *)in_RDI);
  }
  QArrayDataPointer<QGridLayoutBox>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QGridLayoutBox>::needsDetach
                    ((QArrayDataPointer<QGridLayoutBox> *)in_stack_ffffffffffffff50);
  pcVar4 = local_10;
  if ((bVar1) || (qVar2 = capacity((QList<QGridLayoutBox> *)0x8aa5c2), qVar2 < (long)pcVar4)) {
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QGridLayoutBox *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QGridLayoutBox>::operator->(in_RDI);
    QArrayDataPointer<QGridLayoutBox>::detachCapacity
              (in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58);
    QArrayDataPointer<QGridLayoutBox>::QArrayDataPointer
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (qsizetype)in_stack_ffffffffffffff60,
               (AllocationOption)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    QArrayDataPointer<QGridLayoutBox>::operator->(&local_28);
    QtPrivate::QGenericArrayOps<QGridLayoutBox>::copyAppend
              ((QGenericArrayOps<QGridLayoutBox> *)in_stack_ffffffffffffff60,
               (qsizetype)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    QArrayDataPointer<QGridLayoutBox>::swap
              ((QArrayDataPointer<QGridLayoutBox> *)in_stack_ffffffffffffff50,
               (QArrayDataPointer<QGridLayoutBox> *)in_stack_ffffffffffffff48);
    QArrayDataPointer<QGridLayoutBox>::~QArrayDataPointer
              ((QArrayDataPointer<QGridLayoutBox> *)in_stack_ffffffffffffff50);
  }
  else {
    memset(local_58 + 1,0,0x28);
    local_58[1] = 0xffffffffffffffff;
    local_58[2] = 0xffffffffffffffff;
    local_58[3] = 0xffffffffffffffff;
    local_58[4] = 0xffffffffffffffff;
    local_58[5] = 0xffffffffffffffff;
    memcpy(local_58 + 1,in_RSI,0x28);
    QArrayDataPointer<QGridLayoutBox>::operator->(in_RDI);
    QArrayDataPointer<QGridLayoutBox>::begin((QArrayDataPointer<QGridLayoutBox> *)0x8aa703);
    QArrayDataPointer<QGridLayoutBox>::begin((QArrayDataPointer<QGridLayoutBox> *)0x8aa712);
    local_58[0] = size((QList<QGridLayoutBox> *)in_RDI);
    qMin<long_long>(local_58,(longlong *)&local_10);
    QtPrivate::QGenericArrayOps<QGridLayoutBox>::assign
              ((QGenericArrayOps<QGridLayoutBox> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pcVar4 = local_10;
    qVar2 = size((QList<QGridLayoutBox> *)in_RDI);
    if (qVar2 < (long)pcVar4) {
      pQVar3 = (QGenericArrayOps<QGridLayoutBox> *)
               QArrayDataPointer<QGridLayoutBox>::operator->(in_RDI);
      pcVar4 = local_10;
      size((QList<QGridLayoutBox> *)in_RDI);
      QtPrivate::QGenericArrayOps<QGridLayoutBox>::copyAppend
                (pQVar3,(qsizetype)pcVar4,in_stack_ffffffffffffff50);
    }
    else {
      pcVar4 = local_10;
      qVar2 = size((QList<QGridLayoutBox> *)in_RDI);
      if ((long)pcVar4 < qVar2) {
        pQVar3 = (QGenericArrayOps<QGridLayoutBox> *)
                 QArrayDataPointer<QGridLayoutBox>::operator->(in_RDI);
        QtPrivate::QGenericArrayOps<QGridLayoutBox>::truncate(pQVar3,local_10,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QGridLayoutBox> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}